

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARPController.cpp
# Opt level: O0

void __thiscall ARPController::reply(ARPController *this,uint8_t *data,size_t size)

{
  undefined2 *__s;
  iterator __result;
  ssize_t sVar1;
  ostream *this_00;
  ssize_t n;
  undefined2 *puStack_30;
  HwAddr addr;
  arp_t *resp;
  arp_t *arp;
  size_t size_local;
  uint8_t *data_local;
  ARPController *this_local;
  
  __s = (undefined2 *)operator_new(0x1c);
  memset(__s,0,0x1c);
  __s[3] = 0x200;
  *(uint8_t *)(__s + 2) = data[4];
  *__s = *(undefined2 *)data;
  *(uint8_t *)((long)__s + 5) = data[5];
  __s[1] = *(undefined2 *)(data + 2);
  *(undefined4 *)(__s + 0xc) = *(undefined4 *)(data + 0xe);
  *(uint32_t *)(__s + 7) = this->dev->ip_addr;
  puStack_30 = __s;
  std::copy<unsigned_char_const*,unsigned_char*>(data + 8,data + 0xe,(uchar *)(__s + 9));
  std::copy<unsigned_char_const*,unsigned_char*>
            (this->dev->mac_addr,this->dev->mac_addr + 6,(uchar *)(puStack_30 + 4));
  __result = std::begin<std::array<unsigned_char,6ul>>((array<unsigned_char,_6UL> *)((long)&n + 2));
  std::copy<unsigned_char_const*,unsigned_char*>(data + 8,data + 0xe,__result);
  sVar1 = Ethernet::send(this->eth,(int)&n + 2,(void *)0x806,(size_t)puStack_30,0x1c);
  if (sVar1 < 1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"ARP reply failure");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (puStack_30 != (undefined2 *)0x0) {
    operator_delete(puStack_30,0x1c);
  }
  return;
}

Assistant:

void ARPController::reply(uint8_t const *data, size_t size) const {
    auto *arp = reinterpret_cast<arp_t const *>(data);
    auto *resp = new arp_t();

    resp->opcode = static_cast<uint16_t>(Opcode::Reply);
    resp->hw_addr_len = arp->hw_addr_len;
    resp->hw_type = arp->hw_type;
    resp->protocol_addr_len = arp->protocol_addr_len;
    resp->protocol_type = arp->protocol_type;

    resp->target_protocol_addr = arp->sender_protocol_addr;
    resp->sender_protocol_addr = dev.ip_addr;
    std::copy(arp->sender_hw_addr, arp->sender_hw_addr + 6, resp->target_hw_addr);
    std::copy(dev.mac_addr, dev.mac_addr + 6, resp->sender_hw_addr);

    Ethernet::HwAddr addr;
    std::copy(arp->sender_hw_addr, arp->sender_hw_addr + 6, std::begin(addr));

    ssize_t n = eth.send(addr, Ethernet::protocol::ARP, reinterpret_cast<uint8_t *>(resp), sizeof(struct arp_t));
    if (n <= 0) {
        std::cerr << "ARP reply failure" << std::endl;
        std::cerr.flush();
    }
    delete resp;
}